

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void warp_vertical_filter_avx2
               (uint8_t *pred,__m256i *horz_out,ConvolveParams *conv_params,int16_t gamma,
               int16_t delta,int p_height,int p_stride,int p_width,int i,int j,int sy4,
               int reduce_bits_vert,__m256i *res_add_const,int round_bits,__m256i *res_sub_const,
               __m256i *round_bits_const,__m256i *wt)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint8_t *in_RDX;
  undefined1 (*in_RSI) [32];
  int in_R9D;
  int in_stack_00000008;
  __m256i res_lo;
  __m256i coeffs [8];
  int sy;
  __m256i src_5;
  __m256i src_4;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  __m256i src [8];
  int row;
  int k;
  undefined4 in_stack_fffffffffffffa74;
  int in_stack_fffffffffffffaa8;
  int local_548;
  __m256i *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbec;
  int in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  __m256i *in_stack_fffffffffffffbf8;
  __m256i *in_stack_fffffffffffffc00;
  __m256i *in_stack_fffffffffffffc08;
  __m256i *in_stack_fffffffffffffc10;
  __m256i *palStack_398;
  __m256i *palStack_390;
  __m256i *palStack_388;
  int local_204;
  __m256i *res_add_const_00;
  __m256i *res_hi;
  __m256i *res_lo_00;
  
  auVar2 = vperm2i128_avx2(*in_RSI,in_RSI[1],0x21);
  pauVar1 = in_RSI + 1;
  res_add_const_00 = *(__m256i **)*pauVar1;
  res_hi = *(__m256i **)(in_RSI[1] + 8);
  res_lo_00 = *(__m256i **)(in_RSI[1] + 0x10);
  auVar3 = vperm2i128_avx2(in_RSI[1],in_RSI[2],0x21);
  auVar4 = vperm2i128_avx2(in_RSI[2],in_RSI[3],0x21);
  vpunpcklwd_avx2(*in_RSI,auVar2);
  palStack_398 = auVar3._8_8_;
  palStack_390 = auVar3._16_8_;
  palStack_388 = auVar3._24_8_;
  vpunpcklwd_avx2(*pauVar1,auVar3);
  vpunpcklwd_avx2(in_RSI[2],auVar4);
  vpunpckhwd_avx2(*in_RSI,auVar2);
  vpunpckhwd_avx2(*pauVar1,auVar3);
  vpunpckhwd_avx2(in_RSI[2],auVar4);
  local_204 = -4;
  while( true ) {
    if ((in_R9D - p_width) + -4 < 5) {
      local_548 = (in_R9D - p_width) + -4;
    }
    else {
      local_548 = 4;
    }
    if (local_548 <= local_204) break;
    prepare_vertical_filter_coeffs_avx2
              (in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               in_stack_fffffffffffffbe0);
    filter_src_pixels_vertical_avx2
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
               in_stack_fffffffffffffbf8,
               (__m256i *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbec);
    store_vertical_filter_output_avx2
              (res_lo_00,res_hi,res_add_const_00,palStack_388,palStack_390,palStack_398,in_RDX,
               (ConvolveParams *)CONCAT44(in_stack_fffffffffffffa74,p_width),i,local_204,sy4,
               in_stack_00000008,p_stride,(int)res_add_const,in_stack_fffffffffffffaa8);
    local_204 = local_204 + 2;
  }
  return;
}

Assistant:

static inline void warp_vertical_filter_avx2(
    uint8_t *pred, __m256i *horz_out, ConvolveParams *conv_params,
    int16_t gamma, int16_t delta, int p_height, int p_stride, int p_width,
    int i, int j, int sy4, const int reduce_bits_vert,
    const __m256i *res_add_const, const int round_bits,
    const __m256i *res_sub_const, const __m256i *round_bits_const,
    const __m256i *wt) {
  int k, row = 0;
  __m256i src[8];
  const __m256i src_0 = horz_out[0];
  const __m256i src_1 =
      _mm256_permute2x128_si256(horz_out[0], horz_out[1], 0x21);
  const __m256i src_2 = horz_out[1];
  const __m256i src_3 =
      _mm256_permute2x128_si256(horz_out[1], horz_out[2], 0x21);
  const __m256i src_4 = horz_out[2];
  const __m256i src_5 =
      _mm256_permute2x128_si256(horz_out[2], horz_out[3], 0x21);

  src[0] = _mm256_unpacklo_epi16(src_0, src_1);
  src[2] = _mm256_unpacklo_epi16(src_2, src_3);
  src[4] = _mm256_unpacklo_epi16(src_4, src_5);

  src[1] = _mm256_unpackhi_epi16(src_0, src_1);
  src[3] = _mm256_unpackhi_epi16(src_2, src_3);
  src[5] = _mm256_unpackhi_epi16(src_4, src_5);

  for (k = -4; k < AOMMIN(4, p_height - i - 4); k += 2) {
    int sy = sy4 + delta * (k + 4);
    __m256i coeffs[8];
    prepare_vertical_filter_coeffs_avx2(gamma, delta, sy, coeffs);
    __m256i res_lo, res_hi;
    filter_src_pixels_vertical_avx2(horz_out, src, coeffs, &res_lo, &res_hi,
                                    row);
    store_vertical_filter_output_avx2(&res_lo, &res_hi, res_add_const, wt,
                                      res_sub_const, round_bits_const, pred,
                                      conv_params, i, j, k, reduce_bits_vert,
                                      p_stride, p_width, round_bits);
    src[0] = src[2];
    src[2] = src[4];
    src[4] = src[6];
    src[1] = src[3];
    src[3] = src[5];
    src[5] = src[7];

    row += 1;
  }
}